

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_AddMultisigSignConfidentialTx_Test::TestBody
          (cfdcapi_elements_transaction_AddMultisigSignConfidentialTx_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  bool in_stack_000000c7;
  char *in_stack_000000c8;
  int in_stack_000000d0;
  uint32_t in_stack_000000d4;
  char *in_stack_000000d8;
  char *in_stack_000000e0;
  void *in_stack_000000e8;
  char *in_stack_00000100;
  int64_t in_stack_00000108;
  char *in_stack_00000110;
  int in_stack_00000118;
  char **in_stack_00000128;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  char *str_buffer;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *tx_string;
  char *signature;
  int64_t satoshi;
  char *sighash;
  AssertionResult gtest_ar_1;
  void *multisign_handle;
  char *in_stack_000003b0;
  char *in_stack_000003b8;
  void *in_stack_000003c0;
  void *in_stack_000003c8;
  char *in_stack_000003e0;
  AssertionResult gtest_ar_;
  char **in_stack_000003f8;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffbb8;
  AssertionResult *in_stack_fffffffffffffbc0;
  CfdErrorCode *in_stack_fffffffffffffbc8;
  char **in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  void *in_stack_fffffffffffffc20;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  AssertionResult *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  void *in_stack_fffffffffffffc78;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined4 local_2a4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd73;
  int in_stack_fffffffffffffd74;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd78;
  void *in_stack_fffffffffffffd80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd88;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  char *local_248;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  AssertHelper local_180;
  Message local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  undefined1 in_stack_fffffffffffffeab;
  int in_stack_fffffffffffffeac;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  AssertHelper local_130;
  Message local_128;
  char **in_stack_fffffffffffffee0;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  char *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  char *local_d0;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
             (int *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34f78a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x5e2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x34f7ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34f842);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,(type *)0x34f876);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x5e3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x34f972);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34f9ed);
  local_a0 = 0;
  local_14 = CfdInitializeMultisigSign
                       (in_stack_fffffffffffffc78,
                        (void **)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
             (int *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34fac2);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x5e7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x34fb25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34fb7d);
  if (local_14 == 0) {
    local_d0 = (char *)0x0;
    local_d8 = 13000000000000;
    local_e0 = 0;
    local_e8 = (char *)0x0;
    in_stack_fffffffffffffbc0 = (AssertionResult *)0xbd2cc61d000;
    in_stack_fffffffffffffbd8 = 0;
    in_stack_fffffffffffffbd0 = (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),1)
    ;
    in_stack_fffffffffffffbc8 = (CfdErrorCode *)0x0;
    local_14 = CfdCreateConfidentialSighash
                         (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,
                          in_stack_000000d0,in_stack_000000c8,in_stack_00000100,in_stack_00000108,
                          in_stack_00000110,in_stack_00000118,in_stack_000000c7,in_stack_00000128);
    local_fc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (int *)in_stack_fffffffffffffbc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34fcd6);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x5f1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_110,&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      testing::Message::~Message((Message *)0x34fd39);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34fd8e);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffee0,
                 "\"64878cbcd5c1805659d0747097cbf4b9ec5c187ebd80afa996c8fc95bd650b70\"","sighash",
                 "64878cbcd5c1805659d0747097cbf4b9ec5c187ebd80afa996c8fc95bd650b70",local_d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffee0);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34fe3d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x5f3,pcVar2);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        testing::Message::~Message((Message *)0x34fea0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34fef8);
      local_14 = CfdCalculateEcSignature
                           (in_stack_fffffffffffffec8.ptr_,in_stack_fffffffffffffec0,
                            (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            (char *)in_stack_fffffffffffffeb0.ptr_,in_stack_fffffffffffffeac,
                            (bool)in_stack_fffffffffffffeab,in_stack_fffffffffffffee0);
      in_stack_fffffffffffffebc = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 (int *)in_stack_fffffffffffffbc0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffec0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffeb0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34ffe6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffea8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x5f7,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffea8,(Message *)&stack0xfffffffffffffeb0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffea8);
        testing::Message::~Message((Message *)0x350049);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3500a1);
      if (local_14 == 0) {
        local_14 = CfdAddMultisigSignDataToDer
                             (in_stack_fffffffffffffd88.ptr_,in_stack_fffffffffffffd80,
                              (char *)in_stack_fffffffffffffd78.ptr_,in_stack_fffffffffffffd74,
                              (bool)in_stack_fffffffffffffd73,(char *)in_stack_fffffffffffffd68.ptr_
                             );
        local_16c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                   (int *)in_stack_fffffffffffffbc0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x35018f);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x5fb,pcVar2);
          testing::internal::AssertHelper::operator=(&local_180,&local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::Message::~Message((Message *)0x3501f2);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x350247);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
      }
    }
    if (local_14 == 0) {
      local_14 = CfdCalculateEcSignature
                           (in_stack_fffffffffffffec8.ptr_,in_stack_fffffffffffffec0,
                            (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            (char *)in_stack_fffffffffffffeb0.ptr_,in_stack_fffffffffffffeac,
                            (bool)in_stack_fffffffffffffeab,in_stack_fffffffffffffee0);
      local_194 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 (int *)in_stack_fffffffffffffbc0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x350354);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x603,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::Message::~Message((Message *)0x3503b7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x35040f);
      if (local_14 == 0) {
        local_14 = CfdAddMultisigSignDataToDer
                             (in_stack_fffffffffffffd88.ptr_,in_stack_fffffffffffffd80,
                              (char *)in_stack_fffffffffffffd78.ptr_,in_stack_fffffffffffffd74,
                              (bool)in_stack_fffffffffffffd73,(char *)in_stack_fffffffffffffd68.ptr_
                             );
        local_1bc = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                   (int *)in_stack_fffffffffffffbc0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3504fd);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x607,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          testing::Message::~Message((Message *)0x350560);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3505b5);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
      }
    }
    if (local_14 == 0) {
      in_stack_fffffffffffffbd0 = &local_e8;
      in_stack_fffffffffffffbc8 =
           (CfdErrorCode *)((ulong)in_stack_fffffffffffffbc8 & 0xffffffff00000000);
      in_stack_fffffffffffffbc0 = (AssertionResult *)TestBody::multisig_script;
      local_14 = CfdFinalizeElementsMultisigSign
                           (in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,in_stack_000003b0,
                            multisign_handle._4_4_,(int)multisign_handle,in_stack_000003e0,
                            (char *)gtest_ar_._0_8_,gtest_ar_1.message_.ptr_._7_1_,in_stack_000003f8
                           );
      local_1e4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 (int *)in_stack_fffffffffffffbc0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
      if (!bVar1) {
        testing::Message::Message(&local_1f0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3506dc);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x610,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        testing::Message::~Message((Message *)0x35073f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x350794);
      if (local_14 == 0) {
        in_stack_fffffffffffffc50 = &local_208;
        testing::internal::CmpHelperSTREQ
                  ((internal *)in_stack_fffffffffffffc50,
                   "\"0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000d90047304402206fc4cc7e489208a2f4d24f5d35466debab2ce7aa34b5d00e0a9426c9d63529cf02202ec744939ef0b4b629c7d87bc2d017714b52bb86dccb0fd0f10148f62b7a09ba01473044022073ea24720b24c736bcb305a5de2fd8117ca2f0a85d7da378fae5b90dc361d227022004c0088bf1b73a56ae5ec407cf9c330d7206ffbcd0c9bb1c72661726fd4990390147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52aeffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000\""
                   ,"tx_string",
                   "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000d90047304402206fc4cc7e489208a2f4d24f5d35466debab2ce7aa34b5d00e0a9426c9d63529cf02202ec744939ef0b4b629c7d87bc2d017714b52bb86dccb0fd0f10148f62b7a09ba01473044022073ea24720b24c736bcb305a5de2fd8117ca2f0a85d7da378fae5b90dc361d227022004c0088bf1b73a56ae5ec407cf9c330d7206ffbcd0c9bb1c72661726fd4990390147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52aeffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                   ,local_e8);
        in_stack_fffffffffffffc5f =
             testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc50);
        if (!(bool)in_stack_fffffffffffffc5f) {
          testing::Message::Message(&local_210);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x350843);
          testing::internal::AssertHelper::AssertHelper
                    (&local_218,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x612,pcVar2);
          testing::internal::AssertHelper::operator=(&local_218,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_218);
          testing::Message::~Message((Message *)0x3508a6);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3508fb);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
      }
    }
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
    local_14 = CfdFreeMultisigSignHandle
                         ((void *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                          in_stack_fffffffffffffc20);
    local_22c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (int *)in_stack_fffffffffffffbc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3509e2);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x619,pcVar2);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x350a3f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x350a94);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffbff,
                                                  in_stack_fffffffffffffbf8));
  if (local_14 != 0) {
    local_248 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                          (char **)in_stack_fffffffffffffc50);
    local_25c = 0;
    this_00 = &local_258;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (int *)in_stack_fffffffffffffbc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x350b81);
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x620,pcVar2);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::Message::~Message((Message *)0x350bde);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x350c33);
    testing::internal::CmpHelperSTREQ
              ((internal *)&stack0xfffffffffffffd80,"\"\"","str_buffer","",local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd80);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x350cc8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x621,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd70,(Message *)&stack0xfffffffffffffd78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd70);
      testing::Message::~Message((Message *)0x350d25);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x350d7a);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
    local_248 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffbc8);
  local_2a4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
             (int *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffd60);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x350e4a);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x627,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message((Message *)0x350ea7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x350efc);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddMultisigSignConfidentialTx) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";
  static const char* pubkey1 = "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad";
  static const char* privkey1 = "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi";
  static const char* pubkey2 = "02bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d71";
  static const char* privkey2 = "cQUTZ8VbWNYBEtrB7xwe41kqiKMQPRZshTvBHmkoJGaUfmS5pxzR";
  static const char* multisig_script = "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* multisign_handle = nullptr;
  ret = CfdInitializeMultisigSign(handle, &multisign_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    char* sighash = nullptr;
    int64_t satoshi = 13000000000000;
    char* signature = nullptr;
    char* tx_string = nullptr;
    ret = CfdCreateConfidentialSighash(
        handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        kCfdP2sh, nullptr, multisig_script, satoshi, nullptr, kCfdSigHashAll, false, &sighash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("64878cbcd5c1805659d0747097cbf4b9ec5c187ebd80afa996c8fc95bd650b70", sighash);

      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey1, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddMultisigSignDataToDer(
          handle, multisign_handle, signature, kCfdSigHashAll, false, pubkey1);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }

    if (ret == kCfdSuccess) {
      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey2, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddMultisigSignDataToDer(
          handle, multisign_handle, signature, kCfdSigHashAll, false, pubkey2);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }
    if (ret == kCfdSuccess) {
      ret = CfdFinalizeElementsMultisigSign(
          handle, multisign_handle, kTxData,
          "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
          kCfdP2sh, nullptr, multisig_script, false, &tx_string);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000d90047304402206fc4cc7e489208a2f4d24f5d35466debab2ce7aa34b5d00e0a9426c9d63529cf02202ec744939ef0b4b629c7d87bc2d017714b52bb86dccb0fd0f10148f62b7a09ba01473044022073ea24720b24c736bcb305a5de2fd8117ca2f0a85d7da378fae5b90dc361d227022004c0088bf1b73a56ae5ec407cf9c330d7206ffbcd0c9bb1c72661726fd4990390147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52aeffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000", tx_string);
        CfdFreeStringBuffer(tx_string);
      }
    }
    CfdFreeStringBuffer(sighash);

    ret = CfdFreeMultisigSignHandle(handle, multisign_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}